

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O0

WebPMux * WebPMuxCreateInternal(WebPData *bitstream,int copy_data,int version)

{
  long lVar1;
  uint32_t uVar2;
  WebPMuxError WVar3;
  int iVar4;
  WebPMux *mux_00;
  size_t sVar5;
  void *pvVar6;
  WebPChunk **ppWVar7;
  int in_EDX;
  long *in_RDI;
  WebPChunkId id;
  size_t data_size;
  WebPChunk **chunk_list_ends [11];
  WebPChunk chunk;
  size_t size;
  uint8_t *data;
  WebPMuxImage *wpi;
  WebPMux *mux;
  uint8_t *end;
  uint32_t tag;
  size_t riff_size;
  WebPChunkId in_stack_ffffffffffffff28;
  WebPChunkId in_stack_ffffffffffffff2c;
  WebPMuxImage *in_stack_ffffffffffffff30;
  WebPMuxImage *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff4c;
  WebPMuxImage *in_stack_ffffffffffffff50;
  WebPMux *in_stack_ffffffffffffff58;
  uint8_t *in_stack_ffffffffffffff60;
  WebPChunk *in_stack_ffffffffffffff68;
  uint32_t local_70;
  WebPMuxImage *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  WebPChunk *in_stack_ffffffffffffffa8;
  ulong local_50;
  uint8_t *local_48;
  
  memset(&stack0xffffffffffffff38,0,0x58);
  ChunkInit((WebPChunk *)0x1097c0);
  if ((in_EDX >> 8 == 1) && (in_RDI != (long *)0x0)) {
    lVar1 = *in_RDI;
    local_50 = in_RDI[1];
    if ((lVar1 != 0) &&
       ((((0x13 < local_50 &&
          (uVar2 = GetLE32((uint8_t *)in_stack_ffffffffffffff30), uVar2 == 0x46464952)) &&
         (uVar2 = GetLE32((uint8_t *)in_stack_ffffffffffffff30), uVar2 == 0x50424557)) &&
        (mux_00 = WebPMuxNew(), mux_00 != (WebPMux *)0x0)))) {
      uVar2 = GetLE32((uint8_t *)in_stack_ffffffffffffff30);
      if (((uVar2 == 0x20385056) || (uVar2 == 0x4c385056)) || (uVar2 == 0x58385056)) {
        uVar2 = GetLE32((uint8_t *)in_stack_ffffffffffffff30);
        if ((((ulong)uVar2 < 0xfffffff7) && (sVar5 = SizeWithPadding((ulong)uVar2), 7 < sVar5)) &&
           (sVar5 <= local_50)) {
          if (sVar5 + 8 < local_50) {
            local_50 = sVar5 + 8;
          }
          local_48 = (uint8_t *)(lVar1 + 0xc);
          pvVar6 = WebPSafeMalloc((uint64_t)in_stack_ffffffffffffff38,
                                  (size_t)in_stack_ffffffffffffff30);
          if (pvVar6 != (void *)0x0) {
            MuxImageInit((WebPMuxImage *)0x109a22);
            while (local_48 != (uint8_t *)(lVar1 + local_50)) {
              WVar3 = ChunkVerifyAndAssign
                                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                 (size_t)in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50
                                 ,in_stack_ffffffffffffff4c);
              if (WVar3 != WEBP_MUX_OK) goto LAB_00109ce9;
              in_stack_ffffffffffffff30 =
                   (WebPMuxImage *)ChunkDiskSize((WebPChunk *)in_stack_ffffffffffffff30);
              in_stack_ffffffffffffff28 = ChunkGetIdFromTag(local_70);
              in_stack_ffffffffffffff2c = in_stack_ffffffffffffff28;
              if (in_stack_ffffffffffffff28 == WEBP_CHUNK_ANMF) {
                if ((*(int *)((long)pvVar6 + 0x2c) != 0) ||
                   (iVar4 = MuxImageParse(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                          in_stack_ffffffffffffff98), iVar4 == 0))
                goto LAB_00109ce9;
                ChunkRelease((WebPChunk *)
                             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
LAB_00109b3f:
                WVar3 = MuxImagePush(in_stack_ffffffffffffff38,
                                     (WebPMuxImage **)in_stack_ffffffffffffff30);
                if (WVar3 != WEBP_MUX_OK) goto LAB_00109ce9;
                MuxImageInit((WebPMuxImage *)0x109b6b);
              }
              else if (in_stack_ffffffffffffff28 == WEBP_CHUNK_ALPHA) {
                if ((*(long *)((long)pvVar6 + 8) != 0) ||
                   (WVar3 = ChunkSetHead((WebPChunk *)in_stack_ffffffffffffff38,
                                         &in_stack_ffffffffffffff30->header_), WVar3 != WEBP_MUX_OK)
                   ) goto LAB_00109ce9;
                *(undefined4 *)((long)pvVar6 + 0x2c) = 1;
              }
              else {
                if (in_stack_ffffffffffffff28 == WEBP_CHUNK_IMAGE) {
                  WVar3 = ChunkSetHead((WebPChunk *)in_stack_ffffffffffffff38,
                                       &in_stack_ffffffffffffff30->header_);
                  if ((WVar3 == WEBP_MUX_OK) &&
                     (iVar4 = MuxImageFinalize(in_stack_ffffffffffffff50), iVar4 != 0)) {
                    *(undefined4 *)((long)pvVar6 + 0x2c) = 0;
                    goto LAB_00109b3f;
                  }
                  goto LAB_00109ce9;
                }
                if (*(int *)((long)pvVar6 + 0x2c) != 0) goto LAB_00109ce9;
                if (*(long *)(&stack0xffffffffffffff38 + (ulong)in_stack_ffffffffffffff28 * 8) == 0)
                {
                  ppWVar7 = MuxGetChunkListFromId(mux_00,in_stack_ffffffffffffff28);
                  *(WebPChunk ***)(&stack0xffffffffffffff38 + (ulong)in_stack_ffffffffffffff2c * 8)
                       = ppWVar7;
                }
                WVar3 = ChunkAppend((WebPChunk *)in_stack_ffffffffffffff30,
                                    (WebPChunk ***)
                                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
                if (WVar3 != WEBP_MUX_OK) goto LAB_00109ce9;
                if (in_stack_ffffffffffffff2c == WEBP_CHUNK_VP8X) {
                  if (in_stack_ffffffffffffff30 < (WebPMuxImage *)0x12) goto LAB_00109ce9;
                  iVar4 = GetLE24((uint8_t *)0x109c37);
                  mux_00->canvas_width_ = iVar4 + 1;
                  iVar4 = GetLE24((uint8_t *)0x109c58);
                  mux_00->canvas_height_ = iVar4 + 1;
                }
              }
              local_48 = local_48 + (long)&in_stack_ffffffffffffff30->header_;
              ChunkInit((WebPChunk *)0x109ca1);
            }
            if ((*(int *)((long)pvVar6 + 0x2c) == 0) &&
               (WVar3 = MuxValidate(in_stack_ffffffffffffff58), WVar3 == WEBP_MUX_OK)) {
              MuxImageDelete(in_stack_ffffffffffffff30);
              return mux_00;
            }
          }
        }
      }
LAB_00109ce9:
      ChunkRelease((WebPChunk *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      MuxImageDelete(in_stack_ffffffffffffff30);
      WebPMuxDelete((WebPMux *)0x109d0d);
    }
  }
  return (WebPMux *)0x0;
}

Assistant:

WebPMux* WebPMuxCreateInternal(const WebPData* bitstream, int copy_data,
                               int version) {
  size_t riff_size;
  uint32_t tag;
  const uint8_t* end;
  WebPMux* mux = NULL;
  WebPMuxImage* wpi = NULL;
  const uint8_t* data;
  size_t size;
  WebPChunk chunk;
  // Stores the end of the chunk lists so that it is faster to append data to
  // their ends.
  WebPChunk** chunk_list_ends[WEBP_CHUNK_NIL + 1] = { NULL };
  ChunkInit(&chunk);

  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_MUX_ABI_VERSION)) {
    return NULL;  // version mismatch
  }
  if (bitstream == NULL) return NULL;

  data = bitstream->bytes;
  size = bitstream->size;

  if (data == NULL) return NULL;
  if (size < RIFF_HEADER_SIZE + CHUNK_HEADER_SIZE) return NULL;
  if (GetLE32(data + 0) != MKFOURCC('R', 'I', 'F', 'F') ||
      GetLE32(data + CHUNK_HEADER_SIZE) != MKFOURCC('W', 'E', 'B', 'P')) {
    return NULL;
  }

  mux = WebPMuxNew();
  if (mux == NULL) return NULL;

  tag = GetLE32(data + RIFF_HEADER_SIZE);
  if (tag != kChunks[IDX_VP8].tag &&
      tag != kChunks[IDX_VP8L].tag &&
      tag != kChunks[IDX_VP8X].tag) {
    goto Err;  // First chunk should be VP8, VP8L or VP8X.
  }

  riff_size = GetLE32(data + TAG_SIZE);
  if (riff_size > MAX_CHUNK_PAYLOAD) goto Err;

  // Note this padding is historical and differs from demux.c which does not
  // pad the file size.
  riff_size = SizeWithPadding(riff_size);
  if (riff_size < CHUNK_HEADER_SIZE) goto Err;
  if (riff_size > size) goto Err;
  // There's no point in reading past the end of the RIFF chunk.
  if (size > riff_size + CHUNK_HEADER_SIZE) {
    size = riff_size + CHUNK_HEADER_SIZE;
  }

  end = data + size;
  data += RIFF_HEADER_SIZE;
  size -= RIFF_HEADER_SIZE;

  wpi = (WebPMuxImage*)WebPSafeMalloc(1ULL, sizeof(*wpi));
  if (wpi == NULL) goto Err;
  MuxImageInit(wpi);

  // Loop over chunks.
  while (data != end) {
    size_t data_size;
    WebPChunkId id;
    if (ChunkVerifyAndAssign(&chunk, data, size, riff_size,
                             copy_data) != WEBP_MUX_OK) {
      goto Err;
    }
    data_size = ChunkDiskSize(&chunk);
    id = ChunkGetIdFromTag(chunk.tag_);
    switch (id) {
      case WEBP_CHUNK_ALPHA:
        if (wpi->alpha_ != NULL) goto Err;  // Consecutive ALPH chunks.
        if (ChunkSetHead(&chunk, &wpi->alpha_) != WEBP_MUX_OK) goto Err;
        wpi->is_partial_ = 1;  // Waiting for a VP8 chunk.
        break;
      case WEBP_CHUNK_IMAGE:
        if (ChunkSetHead(&chunk, &wpi->img_) != WEBP_MUX_OK) goto Err;
        if (!MuxImageFinalize(wpi)) goto Err;
        wpi->is_partial_ = 0;  // wpi is completely filled.
 PushImage:
        // Add this to mux->images_ list.
        if (MuxImagePush(wpi, &mux->images_) != WEBP_MUX_OK) goto Err;
        MuxImageInit(wpi);  // Reset for reading next image.
        break;
      case WEBP_CHUNK_ANMF:
        if (wpi->is_partial_) goto Err;  // Previous wpi is still incomplete.
        if (!MuxImageParse(&chunk, copy_data, wpi)) goto Err;
        ChunkRelease(&chunk);
        goto PushImage;
      default:  // A non-image chunk.
        if (wpi->is_partial_) goto Err;  // Encountered a non-image chunk before
                                         // getting all chunks of an image.
        if (chunk_list_ends[id] == NULL) {
          chunk_list_ends[id] =
              MuxGetChunkListFromId(mux, id);  // List to add this chunk.
        }
        if (ChunkAppend(&chunk, &chunk_list_ends[id]) != WEBP_MUX_OK) goto Err;
        if (id == WEBP_CHUNK_VP8X) {  // grab global specs
          if (data_size < CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE) goto Err;
          mux->canvas_width_ = GetLE24(data + 12) + 1;
          mux->canvas_height_ = GetLE24(data + 15) + 1;
        }
        break;
    }
    data += data_size;
    size -= data_size;
    ChunkInit(&chunk);
  }

  // Incomplete image.
  if (wpi->is_partial_) goto Err;

  // Validate mux if complete.
  if (MuxValidate(mux) != WEBP_MUX_OK) goto Err;

  MuxImageDelete(wpi);
  return mux;  // All OK;

 Err:  // Something bad happened.
  ChunkRelease(&chunk);
  MuxImageDelete(wpi);
  WebPMuxDelete(mux);
  return NULL;
}